

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

bool duckdb::AllowUnsignedExtensionsSetting::OnGlobalSet
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  InvalidInputException *this;
  bool bVar1;
  string local_40;
  
  if (db != (DatabaseInstance *)0x0) {
    bVar1 = Value::GetValue<bool>(input);
    if (bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Cannot change allow_unsigned_extensions setting while database is running","");
      InvalidInputException::InvalidInputException(this,&local_40);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return true;
}

Assistant:

bool AllowUnsignedExtensionsSetting::OnGlobalSet(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (db && input.GetValue<bool>()) {
		throw InvalidInputException("Cannot change allow_unsigned_extensions setting while database is running");
	}
	return true;
}